

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::number::impl::NumberStringBuilder::insert
          (NumberStringBuilder *this,int32_t index,NumberStringBuilder *other,UErrorCode *status)

{
  bool bVar1;
  bool bVar2;
  uint count;
  int32_t iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ValueOrHeapArray<char16_t> *pVVar7;
  ValueOrHeapArray<UNumberFormatFields> *pVVar8;
  ValueOrHeapArray<char16_t> *pVVar9;
  ValueOrHeapArray<UNumberFormatFields> *pVVar10;
  bool bVar11;
  
  if (this == other) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    count = other->fLength;
    if (count != 0) {
      iVar3 = prepareForInsert(this,index,count,status);
      if (U_ZERO_ERROR < *status) {
        return count;
      }
      bVar1 = other->fUsingHeap;
      lVar5 = (long)other->fZero;
      bVar2 = this->fUsingHeap;
      lVar4 = (long)iVar3;
      uVar6 = 0;
      if (0 < (int)count) {
        uVar6 = (ulong)count;
      }
      while (bVar11 = uVar6 != 0, uVar6 = uVar6 - 1, bVar11) {
        pVVar7 = &this->fChars;
        if ((bVar2 & 1U) != 0) {
          pVVar7 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
        }
        bVar11 = (bVar1 & 1U) == 0;
        pVVar9 = (ValueOrHeapArray<char16_t> *)(other->fChars).heap.ptr;
        if (bVar11) {
          pVVar9 = &other->fChars;
        }
        pVVar7->value[lVar4] = pVVar9->value[lVar5];
        pVVar8 = (ValueOrHeapArray<UNumberFormatFields> *)(other->fFields).heap.ptr;
        if (bVar11) {
          pVVar8 = &other->fFields;
        }
        pVVar10 = &this->fFields;
        if ((bVar2 & 1U) != 0) {
          pVVar10 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
        }
        pVVar10->value[lVar4] = pVVar8->value[lVar5];
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 1;
      }
      return count;
    }
  }
  return 0;
}

Assistant:

int32_t
NumberStringBuilder::insert(int32_t index, const NumberStringBuilder &other, UErrorCode &status) {
    if (this == &other) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t count = other.fLength;
    if (count == 0) {
        // Nothing to insert.
        return 0;
    }
    int32_t position = prepareForInsert(index, count, status);
    if (U_FAILURE(status)) {
        return count;
    }
    for (int32_t i = 0; i < count; i++) {
        getCharPtr()[position + i] = other.charAt(i);
        getFieldPtr()[position + i] = other.fieldAt(i);
    }
    return count;
}